

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImFontGlyphRangesBuilder::AddText(ImFontGlyphRangesBuilder *this,char *text,char *text_end)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  ulong in_RAX;
  uint c;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  while( true ) {
    if (text_end == (char *)0x0) {
      uVar2 = (uint)*text;
    }
    else {
      uVar2 = (uint)(text < text_end);
    }
    if (uVar2 == 0) break;
    uStack_38 = uStack_38 & 0xffffffff;
    iVar3 = ImTextCharFromUtf8((uint *)((long)&uStack_38 + 4),text,text_end);
    if (iVar3 == 0) {
      return;
    }
    text = text + iVar3;
    puVar1 = (uint *)(*(long *)(this + 8) + (ulong)(uStack_38._4_4_ >> 5 & 0x7ff) * 4);
    *puVar1 = *puVar1 | 1 << (uStack_38._4_4_ & 0x1f);
  }
  return;
}

Assistant:

void ImFontGlyphRangesBuilder::AddText(const char* text, const char* text_end)
{
    while (text_end ? (text < text_end) : *text)
    {
        unsigned int c = 0;
        int c_len = ImTextCharFromUtf8(&c, text, text_end);
        text += c_len;
        if (c_len == 0)
            break;
        AddChar((ImWchar)c);
    }
}